

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

double __thiscall
bgui::ImageAdapter<unsigned_char>::getIntensityOfPixel
          (ImageAdapter<unsigned_char> *this,long x,long y)

{
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  SMatrix<long,_2,_3> *this_00;
  long *plVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int d;
  int dmax;
  int dmin;
  SVector<long,_2> p;
  double ret;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar6;
  int local_54;
  int local_50;
  int local_4c;
  SVector<long,_3> local_48;
  SVector<long,_2> local_30;
  double local_20;
  long local_18;
  long local_10;
  
  local_20 = *(double *)(in_RDI + 0x80) - 1.0;
  local_10 = (long)((double)in_RSI / *(double *)(in_RDI + 0x48));
  local_18 = (long)((double)in_RDX / *(double *)(in_RDI + 0x48));
  this_00 = (SMatrix<long,_2,_3> *)(in_RDI + 0x18);
  gmath::SVector<long,_3>::SVector(&local_48,local_10,local_18,1);
  gmath::SMatrix<long,_2,_3>::operator*
            (this_00,(SVector<long,_3> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_4c = 0;
  local_50 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth
                       (*(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)
                         (in_RDI + 0x70));
  local_50 = local_50 + -1;
  if (-1 < *(int *)(in_RDI + 8)) {
    iVar6 = *(int *)(in_RDI + 8);
    iVar4 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth
                      (*(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)
                        (in_RDI + 0x70));
    if (iVar6 < iVar4) {
      local_50 = *(int *)(in_RDI + 8);
      local_4c = local_50;
    }
  }
  for (local_54 = local_4c; local_54 <= local_50; local_54 = local_54 + 1) {
    pIVar1 = *(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)(in_RDI + 0x70);
    plVar5 = gmath::SVector<long,_2>::operator[](&local_30,0);
    lVar2 = *plVar5;
    plVar5 = gmath::SVector<long,_2>::operator[](&local_30,1);
    bVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                      (pIVar1,lVar2,*plVar5,local_54);
    if (local_20 < (double)bVar3) {
      pIVar1 = *(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> **)(in_RDI + 0x70);
      plVar5 = gmath::SVector<long,_2>::operator[](&local_30,0);
      lVar2 = *plVar5;
      plVar5 = gmath::SVector<long,_2>::operator[](&local_30,1);
      bVar3 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                        (pIVar1,lVar2,*plVar5,local_54);
      local_20 = (double)bVar3;
    }
  }
  if ((local_20 < *(double *)(in_RDI + 0x80)) ||
     (*(double *)(in_RDI + 0x88) <= local_20 && local_20 != *(double *)(in_RDI + 0x88))) {
    local_20 = std::numeric_limits<double>::infinity();
  }
  return local_20;
}

Assistant:

double getIntensityOfPixel(long x, long y) const
    {
      double ret=vmin-1;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      int dmin=0;
      int dmax=image->getDepth()-1;

      if (channel >= 0 && channel < image->getDepth())
      {
        dmin=dmax=channel;
      }

      for (int d=dmin; d<=dmax; d++)
      {
        if (image->get(p[0], p[1], d) > ret)
        {
          ret=image->get(p[0], p[1], d);
        }
      }

      if (ret < vmin || ret > vmax)
      {
        ret=std::numeric_limits<double>::infinity();
      }

      return ret;
    }